

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::readFromFile(Dictionary *this,istream *in)

{
  element_type *peVar1;
  bool bVar2;
  ostream *poVar3;
  Dictionary *this_00;
  invalid_argument *this_01;
  long t;
  string word;
  
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  t = 1;
  this_00 = this;
  while( true ) {
    bVar2 = readWord(this_00,in,&word);
    if (!bVar2) break;
    this_00 = this;
    add(this,&word);
    if ((this->ntokens_ % 1000000 == 0) &&
       (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            verbose)) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"\rRead ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      this_00 = (Dictionary *)std::operator<<(poVar3,"M words");
      std::ostream::flush();
    }
    if (22500000 < this->size_) {
      t = t + 1;
      this_00 = this;
      threshold(this,t,t);
    }
  }
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  threshold(this,(long)peVar1->minCount,(long)peVar1->minCountLabel);
  initTableDiscard(this);
  initNgrams(this);
  if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          verbose) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\rRead ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,"M words");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Number of words:  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->nwords_);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Number of labels: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->nlabels_);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if (this->size_ != 0) {
    std::__cxx11::string::~string((string *)&word);
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_01,"Empty vocabulary. Try a smaller -minCount value.");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Dictionary::readFromFile(std::istream& in) {
  std::string word;
  int64_t minThreshold = 1;
  while (readWord(in, word)) {
    add(word);
    if (ntokens_ % 1000000 == 0 && args_->verbose > 1) {
      std::cerr << "\rRead " << ntokens_ / 1000000 << "M words" << std::flush;
    }
    if (size_ > 0.75 * MAX_VOCAB_SIZE) {
      minThreshold++;
      threshold(minThreshold, minThreshold);
    }
  }
  threshold(args_->minCount, args_->minCountLabel);
  initTableDiscard();
  initNgrams();
  if (args_->verbose > 0) {
    std::cerr << "\rRead " << ntokens_ / 1000000 << "M words" << std::endl;
    std::cerr << "Number of words:  " << nwords_ << std::endl;
    std::cerr << "Number of labels: " << nlabels_ << std::endl;
  }
  if (size_ == 0) {
    throw std::invalid_argument(
        "Empty vocabulary. Try a smaller -minCount value.");
  }
}